

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t jessilib::find<char32_t,char,false>
                 (basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_substring)

{
  char32_t lhs;
  bool bVar1;
  size_t sVar2;
  jessilib *pjVar3;
  jessilib *pjVar4;
  jessilib *extraout_RDX;
  char *pcVar5;
  size_t sVar6;
  jessilib *this;
  jessilib *this_00;
  jessilib *pjVar7;
  decode_result dVar8;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  char32_t *local_58;
  
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pjVar3 = (jessilib *)in_substring._M_len;
  if (pjVar3 == (jessilib *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pjVar3 == (jessilib *)0x1) {
        in_string_00._M_str._0_4_ = (int)*in_substring._M_str;
        in_string_00._M_str._4_4_ = 0;
        sVar2 = find<char32_t,false>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar2;
      }
      sVar6 = 0;
      local_58 = in_string_00._M_len;
      while( true ) {
        sVar2 = 0xffffffffffffffff;
        if (this == (jessilib *)0x0) break;
        pjVar7 = (jessilib *)0x0;
        pjVar4 = pjVar3;
        pcVar5 = in_substring._M_str;
        this_00 = pjVar3;
        do {
          lhs = local_58[(long)pjVar7];
          in_string_01._M_str = (char *)pjVar4;
          in_string_01._M_len = (size_t)pcVar5;
          dVar8 = decode_codepoint_utf8<char>(this_00,in_string_01);
          sVar2 = dVar8.units;
          if (sVar2 == 0) {
            return 0xffffffffffffffff;
          }
          bVar1 = equalsi(lhs,dVar8.codepoint);
          if (!bVar1) break;
          this_00 = this_00 + -sVar2;
          if (this_00 == (jessilib *)0x0) {
            return sVar6;
          }
          pcVar5 = pcVar5 + sVar2;
          pjVar7 = pjVar7 + 1;
          pjVar4 = extraout_RDX;
        } while (this != pjVar7);
        local_58 = local_58 + 1;
        sVar6 = sVar6 + 1;
        this = this + -1;
      }
    }
  }
  return sVar2;
}

Assistant:

size_t find(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_substring) {
	// If we're searching for nothing, then we've found it at the front
	if (in_substring.empty()) {
		return 0;
	}

	// If we don't have anything to search through, there's nothing to be found
	if (in_string.empty()) {
		return decltype(in_string)::npos;
	}

	// TODO: expand this to cover any instance where in_substring is a single codepoint, rather than a single data unit
	if (in_substring.size() == 1) {
		return find<LhsCharT, CaseSensitive>(in_string, in_substring[0]);
	}

	// TODO: optimize for when in_substring is small and of different type, by only decoding it once

	size_t codepoints_removed{};
	while (!in_string.empty()) {
		// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
		if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
			if (in_string.size() < in_substring.size()) {
				return decltype(in_string)::npos;
			}
		}

		std::basic_string_view<LhsCharT> string = in_string;
		std::basic_string_view<RhsCharT> substring = in_substring;
		decode_result string_front;
		do {
			// TODO: optimize this for when in_string and in_substring are same type, by only decoding in_string, solely
			// to determine number of data units to compare
			string_front = decode_codepoint(string);
			decode_result prefix_front = decode_codepoint(substring);

			if (string_front.units == 0
				|| prefix_front.units == 0) {
				// Failed to decode front codepoint; bad unicode sequence
				return decltype(in_string)::npos;
			}

			if constexpr (CaseSensitive) {
				if (string_front.codepoint != prefix_front.codepoint) {
					// Codepoints aren't the same; break & try next position
					break;
				}
			}
			else {
				if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
					// Codepoints don't fold the same; break & try next position
					break;
				}
			}

			// Codepoints are equal; trim off the fronts and continue
			string.remove_prefix(string_front.units);
			substring.remove_prefix(prefix_front.units);

			if (substring.empty()) {
				// We found the substring! We can return our current position
				return codepoints_removed;
			}
		} while (!string.empty());

		// Didn't find a match here; remove the front codepoint and try the next position
		in_string.remove_prefix(string_front.units);
		codepoints_removed += string_front.units;
	}

	// We reached the end of in_string before finding the prefix :(
	return decltype(in_string)::npos;
}